

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Search.cpp
# Opt level: O2

vss * Search::generalSearch
                (vss *__return_storage_ptr__,Problem *problem,int iterationLimit,int fringeSize,
                bool isRandomInitialize,int expanderCode,int completenessCode)

{
  ostream *poVar1;
  int iVar2;
  bool bVar3;
  vector<State,_std::allocator<State>_> fringe;
  vector<State,_std::allocator<State>_> newfringe;
  State randomState;
  vector<State,_std::allocator<State>_> local_f0;
  vector<State,_std::allocator<State>_> local_d8;
  vector<State,_std::allocator<State>_> local_c0;
  vector<State,_std::allocator<State>_> local_a8;
  vector<State,_std::allocator<State>_> local_90;
  string local_78;
  State local_58;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Entered general search");
  std::endl<char,std::char_traits<char>>(poVar1);
  fringe.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  fringe.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  fringe.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  newfringe.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  newfringe.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  newfringe.super__Vector_base<State,_std::allocator<State>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Problem::clearValidStore(problem);
  if (isRandomInitialize) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Random initialization");
    std::endl<char,std::char_traits<char>>(poVar1);
    iVar2 = 0;
    if (0 < fringeSize) {
      iVar2 = fringeSize;
    }
    while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
      Problem::generateRandomState(&randomState,problem);
      poVar1 = std::operator<<((ostream *)&std::cout,"State: ");
      State::State(&local_58,&randomState);
      Problem::getStringFromState_abi_cxx11_(&local_78,problem,&local_58);
      poVar1 = std::operator<<(poVar1,(string *)&local_78);
      std::endl<char,std::char_traits<char>>(poVar1);
      std::__cxx11::string::~string((string *)&local_78);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_58);
      std::vector<State,_std::allocator<State>_>::push_back(&fringe,&randomState);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&randomState);
    }
  }
  else {
    Problem::getInitialState(&randomState,problem);
    std::vector<State,_std::allocator<State>_>::emplace_back<State>(&fringe,&randomState);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&randomState);
    iVar2 = 1;
    if (1 < fringeSize) {
      iVar2 = fringeSize;
    }
    while (iVar2 = iVar2 + -1, iVar2 != 0) {
      Problem::generateRandomState(&randomState,problem);
      std::vector<State,_std::allocator<State>_>::push_back(&fringe,&randomState);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&randomState);
    }
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Initialized fringe");
  std::endl<char,std::char_traits<char>>(poVar1);
  iVar2 = 0;
  if (iterationLimit < 1) {
    iterationLimit = 0;
  }
  do {
    std::vector<State,_std::allocator<State>_>::vector(&local_90,&fringe);
    Problem::fringeExpander
              ((vector<State,_std::allocator<State>_> *)&randomState,problem,&local_90,fringeSize,0)
    ;
    std::vector<State,_std::allocator<State>_>::_M_move_assign(&newfringe,&randomState);
    std::vector<State,_std::allocator<State>_>::~vector
              ((vector<State,_std::allocator<State>_> *)&randomState);
    std::vector<State,_std::allocator<State>_>::~vector(&local_90);
    poVar1 = std::operator<<((ostream *)&std::cout,"Computed new fringe");
    std::endl<char,std::char_traits<char>>(poVar1);
    if (iterationLimit == iVar2) {
      poVar1 = std::operator<<((ostream *)&std::cout,"Exceeded max iterations");
      std::endl<char,std::char_traits<char>>(poVar1);
LAB_00105909:
      Problem::getValidStore(__return_storage_ptr__,problem);
      std::vector<State,_std::allocator<State>_>::~vector(&newfringe);
      std::vector<State,_std::allocator<State>_>::~vector(&fringe);
      return __return_storage_ptr__;
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"Iteration: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
    std::endl<char,std::char_traits<char>>(poVar1);
    if (completenessCode == 0) {
      std::vector<State,_std::allocator<State>_>::vector(&local_d8,&fringe);
      std::vector<State,_std::allocator<State>_>::vector(&local_a8,&newfringe);
      bVar3 = isCompleteLocalMaximum(&local_d8,&local_a8);
      std::vector<State,_std::allocator<State>_>::~vector(&local_a8);
      std::vector<State,_std::allocator<State>_>::~vector(&local_d8);
      if (bVar3) goto LAB_001058ee;
    }
    else {
      std::vector<State,_std::allocator<State>_>::vector(&local_f0,&fringe);
      std::vector<State,_std::allocator<State>_>::vector(&local_c0,&newfringe);
      bVar3 = isCompleteLocalMaximum(&local_f0,&local_c0);
      std::vector<State,_std::allocator<State>_>::~vector(&local_c0);
      std::vector<State,_std::allocator<State>_>::~vector(&local_f0);
      if (bVar3) {
LAB_001058ee:
        poVar1 = std::operator<<((ostream *)&std::cout,"Reached Local maxima");
        std::endl<char,std::char_traits<char>>(poVar1);
        goto LAB_00105909;
      }
    }
    std::vector<State,_std::allocator<State>_>::operator=(&fringe,&newfringe);
    iVar2 = iVar2 + 1;
  } while( true );
}

Assistant:

vss Search::generalSearch(Problem *problem, int iterationLimit, int fringeSize, bool isRandomInitialize,
                          int expanderCode, int completenessCode) {
    cout<<"Entered general search"<<endl;
    vector<State> fringe;
    vector<State> newfringe;
    problem->clearValidStore();

    // Initialize fringe
    if (isRandomInitialize) {
        cout<<"Random initialization"<<endl;
        for (int i = 0; i < fringeSize; ++i) {
            State randomState = problem->generateRandomState();
            cout<<"State: "<<problem->getStringFromState(randomState)<<endl;
            fringe.push_back(randomState);
        }
    }
    else {
        fringe.push_back(problem->getInitialState());
        for (int i = 0; i < fringeSize - 1; ++i) {
            State randomState = problem->generateRandomState();
            fringe.push_back(randomState);
        }
    }
    cout<<"Initialized fringe"<<endl;

    int iterationCount = 0;
    bool run = true;

    while (run) {
        newfringe = problem->fringeExpander(fringe, fringeSize, 0);
        cout<<"Computed new fringe"<<endl;

        // Check if search is complete
        if (iterationCount >= iterationLimit) {
            run = false;
            cout << "Exceeded max iterations" << endl;
            break;
        }

        cout<<"Iteration: "<<iterationCount<<endl;
        // cout<<"Best state: "<<problem->getStringFromState(newfringe[0])<<endl;

        bool isComplete;

        /*
         * Codes for completeness checking functions
         * 0 : terminate if local maximum found
         */
        switch (completenessCode) {
            case 0:
                isComplete = isCompleteLocalMaximum(fringe, newfringe);
                break;
            default:
                isComplete = isCompleteLocalMaximum(fringe, newfringe);
        }
        if (isComplete) {
            run = false;
            cout << "Reached Local maxima" << endl;
            break;
        }

        fringe = newfringe;
        iterationCount++;
    }

    return problem->getValidStore();

}